

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_emulated_ahyper_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0,GLSLstd450 op)

{
  char (*ts) [6];
  char *pcVar1;
  CompilerError *this_00;
  char (*in_stack_fffffffffffffdf8) [3];
  char **in_stack_fffffffffffffe00;
  char *local_1c8;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  byte local_49;
  undefined1 local_48 [7];
  bool forward;
  string expr;
  char *one;
  GLSLstd450 op_local;
  uint32_t op0_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pcVar1 = "1.0";
  if (((this->backend).float_literal_suffix & 1U) != 0) {
    pcVar1 = "1.0f";
  }
  expr.field_2._8_8_ = pcVar1;
  ::std::__cxx11::string::string((string *)local_48);
  local_49 = should_forward(this,op0);
  if (op == GLSLstd450Asinh) {
    to_enclosed_expression_abi_cxx11_(&local_a0,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_c0,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_e0,this,op0,true);
    join<char_const(&)[5],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const*&,char_const(&)[3]>
              (&local_80,(spirv_cross *)"log(",(char (*) [5])&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + sqrt(",
               (char (*) [9])&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x672d14,
               (char (*) [4])&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66a9b3,
               (char (*) [4])((long)&expr.field_2 + 8),(char **)0x671114,in_stack_fffffffffffffdf8);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    emit_op(this,result_type,id,(string *)local_48,(bool)(local_49 & 1),false);
  }
  else if (op == GLSLstd450Acosh) {
    to_enclosed_expression_abi_cxx11_(&local_120,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_140,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_160,this,op0,true);
    join<char_const(&)[5],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const*&,char_const(&)[3]>
              (&local_100,(spirv_cross *)"log(",(char (*) [5])&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + sqrt(",
               (char (*) [9])&local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x672d14,
               (char (*) [4])&local_160,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66396a,
               (char (*) [4])((long)&expr.field_2 + 8),(char **)0x671114,in_stack_fffffffffffffdf8);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_160);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    if (op != GLSLstd450Atanh) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid op.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    to_enclosed_expression_abi_cxx11_(&local_1a0,this,op0,true);
    to_enclosed_expression_abi_cxx11_(&local_1c0,this,op0,true);
    local_1c8 = "";
    if (((this->backend).float_literal_suffix & 1U) != 0) {
      local_1c8 = "f";
    }
    ts = (char (*) [6])((long)&expr.field_2 + 8);
    join<char_const(&)[6],char_const*&,char_const(&)[4],std::__cxx11::string,char_const(&)[6],char_const*&,char_const(&)[4],std::__cxx11::string,char_const(&)[9],char_const*>
              (&local_180,(spirv_cross *)"log((",ts,(char **)0x66a9b3,(char (*) [4])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") / (",ts,
               (char **)0x66396a,(char (*) [4])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")) * 0.5",
               (char (*) [9])&local_1c8,in_stack_fffffffffffffe00);
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1a0);
  }
  emit_op(this,result_type,id,(string *)local_48,(bool)(local_49 & 1),false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,id,op0);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerGLSL::emit_emulated_ahyper_op(uint32_t result_type, uint32_t id, uint32_t op0, GLSLstd450 op)
{
	const char *one = backend.float_literal_suffix ? "1.0f" : "1.0";
	std::string expr;
	bool forward = should_forward(op0);

	switch (op)
	{
	case GLSLstd450Asinh:
		expr = join("log(", to_enclosed_expression(op0), " + sqrt(",
		            to_enclosed_expression(op0), " * ", to_enclosed_expression(op0), " + ", one, "))");
		emit_op(result_type, id, expr, forward);
		break;

	case GLSLstd450Acosh:
		expr = join("log(", to_enclosed_expression(op0), " + sqrt(",
		            to_enclosed_expression(op0), " * ", to_enclosed_expression(op0), " - ", one, "))");
		break;

	case GLSLstd450Atanh:
		expr = join("log((", one, " + ", to_enclosed_expression(op0), ") / "
		            "(", one, " - ", to_enclosed_expression(op0), ")) * 0.5",
		            backend.float_literal_suffix ? "f" : "");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid op.");
	}

	emit_op(result_type, id, expr, forward);
	inherit_expression_dependencies(id, op0);
}